

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O3

void __thiscall Test_aistr_assign_Test::~Test_aistr_assign_Test(Test_aistr_assign_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(Test_aistr, assign) {
    char buf[10] = {0};

    EXPECT_THROW(ai::assign(buf, nullptr), std::invalid_argument);

    ai::assign(buf, "1234");
    ASSERT_EQ(std::string(buf), "1234");
    ai::assign(buf, "");
    ASSERT_EQ(std::string(buf), "");

    ai::assign(buf, "123456789");
    ASSERT_EQ(std::string(buf), "123456789");

    ai::assign(buf, "12345678901");
    ASSERT_EQ(std::string(buf), "123456789");
}